

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

Id __thiscall
spv::Builder::makeGenericType
          (Builder *this,Op opcode,
          vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *operands)

{
  unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
  *this_00;
  iterator __position;
  bool bVar1;
  Builder *pBVar2;
  int iVar3;
  Id IVar4;
  mapped_type *pmVar5;
  Instruction *pIVar6;
  pointer pIVar7;
  vector<spv::Instruction*,std::allocator<spv::Instruction*>> *this_01;
  long lVar8;
  ulong uVar9;
  long lVar10;
  size_type __n;
  bool bVar11;
  Instruction *type;
  Instruction *local_50;
  _Head_base<0UL,_spv::Instruction_*,_false> local_48;
  Id local_40;
  Op local_3c;
  Builder *local_38;
  
  this_00 = &this->groupedTypes;
  local_48._M_head_impl._0_4_ = opcode;
  local_38 = this;
  pmVar5 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,(key_type *)&local_48);
  iVar3 = (int)((ulong)((long)(pmVar5->
                              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pmVar5->
                             super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 3);
  bVar1 = 0 < iVar3;
  if (0 < iVar3) {
    lVar10 = 0;
    local_3c = opcode;
    do {
      local_48._M_head_impl._0_4_ = opcode;
      pmVar5 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,(key_type *)&local_48);
      local_50 = (pmVar5->
                 super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[lVar10];
      iVar3 = Instruction::getNumOperands(local_50);
      if ((long)(operands->super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(operands->super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>).
                _M_impl.super__Vector_impl_data._M_start >> 3 == (long)iVar3) {
        pIVar7 = (operands->super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        bVar11 = true;
        if (0xffffffff <
            ((long)(operands->
                   super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pIVar7) * 0x20000000) {
          lVar8 = 0;
          do {
            if (pIVar7[lVar8].isId == true) {
              IVar4 = Instruction::getIdOperand(local_50,(int)lVar8);
            }
            else {
              IVar4 = Instruction::getImmediateOperand(local_50,(int)lVar8);
            }
            bVar11 = IVar4 == (operands->
                              super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>
                              )._M_impl.super__Vector_impl_data._M_start[lVar8].word;
            if (!bVar11) goto LAB_0045ccbc;
            lVar8 = lVar8 + 1;
            pIVar7 = (operands->
                     super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>).
                     _M_impl.super__Vector_impl_data._M_start;
          } while (lVar8 < (int)((ulong)((long)(operands->
                                               super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>
                                               )._M_impl.super__Vector_impl_data._M_finish -
                                        (long)pIVar7) >> 3));
        }
        if (bVar11) {
          local_40 = local_50->resultId;
        }
LAB_0045ccbc:
        opcode = local_3c;
        if (bVar11) break;
      }
      lVar10 = lVar10 + 1;
      local_48._M_head_impl._0_4_ = opcode;
      pmVar5 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,(key_type *)&local_48);
      lVar8 = (long)(int)((ulong)((long)(pmVar5->
                                        super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pmVar5->
                                       super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                                       )._M_impl.super__Vector_impl_data._M_start) >> 3);
      bVar1 = lVar10 < lVar8;
    } while (lVar10 < lVar8);
  }
  if (!bVar1) {
    pIVar6 = (Instruction *)operator_new(0x60);
    pBVar2 = local_38;
    IVar4 = local_38->uniqueId + 1;
    local_38->uniqueId = IVar4;
    pIVar6->_vptr_Instruction = (_func_int **)&PTR__Instruction_00b0d9f8;
    pIVar6->resultId = IVar4;
    pIVar6->typeId = 0;
    pIVar6->opCode = opcode;
    (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_offset = 0;
    (pIVar6->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pIVar6->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pIVar6->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset = 0;
    (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
    pIVar6->block = (Block *)0x0;
    __n = (long)(operands->super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(operands->super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>).
                _M_impl.super__Vector_impl_data._M_start >> 3;
    local_50 = pIVar6;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&pIVar6->operands,__n);
    std::vector<bool,_std::allocator<bool>_>::reserve(&pIVar6->idOperand,__n);
    pIVar7 = (operands->super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((operands->super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>)._M_impl.
        super__Vector_impl_data._M_finish != pIVar7) {
      uVar9 = 0;
      do {
        if (pIVar7[uVar9].isId == true) {
          Instruction::addIdOperand(local_50,pIVar7[uVar9].word);
        }
        else {
          Instruction::addImmediateOperand(local_50,pIVar7[uVar9].word);
        }
        uVar9 = uVar9 + 1;
        pIVar7 = (operands->super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar9 < (ulong)((long)(operands->
                                     super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pIVar7 >> 3
                              ));
    }
    local_48._M_head_impl._0_4_ = opcode;
    this_01 = (vector<spv::Instruction*,std::allocator<spv::Instruction*>> *)
              std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,(key_type *)&local_48);
    __position._M_current = *(Instruction ***)(this_01 + 8);
    if (__position._M_current == *(Instruction ***)(this_01 + 0x10)) {
      std::vector<spv::Instruction*,std::allocator<spv::Instruction*>>::
      _M_realloc_insert<spv::Instruction*const&>(this_01,__position,&local_50);
    }
    else {
      *__position._M_current = local_50;
      *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 8;
    }
    local_48._M_head_impl = local_50;
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)&pBVar2->constantsTypesGlobals,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_48);
    if (local_48._M_head_impl != (Instruction *)0x0) {
      (*(local_48._M_head_impl)->_vptr_Instruction[1])();
    }
    Module::mapInstruction(&pBVar2->module,local_50);
    local_40 = local_50->resultId;
  }
  return local_40;
}

Assistant:

Id Builder::makeGenericType(spv::Op opcode, std::vector<spv::IdImmediate>& operands)
{
    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedTypes[opcode].size(); ++t) {
        type = groupedTypes[opcode][t];
        if (static_cast<size_t>(type->getNumOperands()) != operands.size())
            continue; // Number mismatch, find next

        bool match = true;
        for (int op = 0; match && op < (int)operands.size(); ++op) {
            match = (operands[op].isId ? type->getIdOperand(op) : type->getImmediateOperand(op)) == operands[op].word;
        }
        if (match)
            return type->getResultId();
    }

    // not found, make it
    type = new Instruction(getUniqueId(), NoType, opcode);
    type->reserveOperands(operands.size());
    for (size_t op = 0; op < operands.size(); ++op) {
        if (operands[op].isId)
            type->addIdOperand(operands[op].word);
        else
            type->addImmediateOperand(operands[op].word);
    }
    groupedTypes[opcode].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    return type->getResultId();
}